

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeSetSort(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val;
  int local_1c;
  int n_set;
  xmlNodeSetPtr set;
  int mem_base;
  int test_ret;
  
  set._4_4_ = 0;
  for (local_1c = 0; local_1c < 1; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlNodeSetPtr(local_1c,0);
    xmlXPathNodeSetSort(val);
    call_tests = call_tests + 1;
    des_xmlNodeSetPtr(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetSort",(ulong)(uint)(iVar2 - iVar1));
      set._4_4_ = set._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return set._4_4_;
}

Assistant:

static int
test_xmlXPathNodeSetSort(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodeSetPtr set; /* the node set */
    int n_set;

    for (n_set = 0;n_set < gen_nb_xmlNodeSetPtr;n_set++) {
        mem_base = xmlMemBlocks();
        set = gen_xmlNodeSetPtr(n_set, 0);

        xmlXPathNodeSetSort(set);
        call_tests++;
        des_xmlNodeSetPtr(n_set, set, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeSetSort",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_set);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}